

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_dyn_tallocr_free_tensor
               (ggml_dyn_tallocr *alloc,size_t offset,size_t size,ggml_tensor *tensor)

{
  size_t sVar1;
  size_t *psVar2;
  size_t in_RDX;
  ulong in_RSI;
  size_t *in_RDI;
  bool bVar3;
  int i_1;
  int insert_pos;
  int j_1;
  int j;
  free_block *block;
  int i;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_24;
  
  sVar1 = aligned_offset((void *)0x0,in_RDX,*in_RDI);
  local_24 = 0;
  while( true ) {
    if ((int)in_RDI[1] <= local_24) {
      if ((int)in_RDI[1] < 0x100) {
        local_3c = 0;
        while( true ) {
          bVar3 = false;
          if (local_3c < (int)in_RDI[1]) {
            bVar3 = in_RDI[(long)local_3c * 2 + 2] < in_RSI;
          }
          if (!bVar3) break;
          local_3c = local_3c + 1;
        }
        for (local_40 = (int)in_RDI[1]; local_3c < local_40; local_40 = local_40 + -1) {
          in_RDI[(long)local_40 * 2 + 2] = in_RDI[(long)(local_40 + -1) * 2 + 2];
          (in_RDI + (long)local_40 * 2 + 2)[1] = (in_RDI + (long)(local_40 + -1) * 2 + 2)[1];
        }
        in_RDI[(long)local_3c * 2 + 2] = in_RSI;
        in_RDI[(long)local_3c * 2 + 3] = sVar1;
        *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
        return;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-alloc.c"
                 ,0x117,"GGML_ASSERT(%s) failed",
                 "alloc->n_free_blocks < MAX_FREE_BLOCKS && \"out of free blocks\"");
    }
    psVar2 = in_RDI + (long)local_24 * 2 + 2;
    if (*psVar2 + psVar2[1] == in_RSI) {
      psVar2[1] = sVar1 + psVar2[1];
      if ((int)in_RDI[1] + -1 <= local_24) {
        return;
      }
      if (*psVar2 + psVar2[1] != in_RDI[(long)(local_24 + 1) * 2 + 2]) {
        return;
      }
      psVar2[1] = in_RDI[(long)(local_24 + 1) * 2 + 3] + psVar2[1];
      *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
      while (local_34 = local_24 + 1, local_34 < (int)in_RDI[1]) {
        in_RDI[(long)local_34 * 2 + 2] = in_RDI[(long)(local_24 + 2) * 2 + 2];
        (in_RDI + (long)local_34 * 2 + 2)[1] = (in_RDI + (long)(local_24 + 2) * 2 + 2)[1];
        local_24 = local_34;
      }
      return;
    }
    if (in_RSI + sVar1 == *psVar2) break;
    local_24 = local_24 + 1;
  }
  *psVar2 = in_RSI;
  psVar2[1] = sVar1 + psVar2[1];
  if (local_24 < 1) {
    return;
  }
  if (in_RDI[(long)(local_24 + -1) * 2 + 2] + in_RDI[(long)(local_24 + -1) * 2 + 3] != *psVar2) {
    return;
  }
  in_RDI[(long)(local_24 + -1) * 2 + 3] = psVar2[1] + in_RDI[(long)(local_24 + -1) * 2 + 3];
  *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
  for (local_38 = local_24; local_38 < (int)in_RDI[1]; local_38 = local_38 + 1) {
    in_RDI[(long)local_38 * 2 + 2] = in_RDI[(long)(local_38 + 1) * 2 + 2];
    (in_RDI + (long)local_38 * 2 + 2)[1] = (in_RDI + (long)(local_38 + 1) * 2 + 2)[1];
  }
  return;
}

Assistant:

static void ggml_dyn_tallocr_free_tensor(struct ggml_dyn_tallocr * alloc, size_t offset, size_t size, const struct ggml_tensor * tensor) {
    size = aligned_offset(NULL, size, alloc->alignment);

    AT_PRINTF("%s: freeing %s at %zu (%zu bytes) - n_free_blocks = %d\n", __func__, tensor->name, offset, size, alloc->n_free_blocks);

#ifdef GGML_ALLOCATOR_DEBUG
    remove_allocated_tensor(alloc, offset, tensor);
#endif

    // see if we can merge with an existing block
    for (int i = 0; i < alloc->n_free_blocks; i++) {
        struct free_block * block = &alloc->free_blocks[i];
        // check if ptr is at the end of the block
        if (block->offset + block->size == offset) {
            block->size += size;
            // check if we can merge with the next block
            if (i < alloc->n_free_blocks - 1 && block->offset + block->size == alloc->free_blocks[i+1].offset) {
                block->size += alloc->free_blocks[i+1].size;
                alloc->n_free_blocks--;
                for (int j = i+1; j < alloc->n_free_blocks; j++) {
                    alloc->free_blocks[j] = alloc->free_blocks[j+1];
                }
            }
            return;
        }
        // check if ptr is at the beginning of the block
        if (offset + size == block->offset) {
            block->offset = offset;
            block->size += size;
            // check if we can merge with the previous block
            if (i > 0 && alloc->free_blocks[i-1].offset + alloc->free_blocks[i-1].size == block->offset) {
                alloc->free_blocks[i-1].size += block->size;
                alloc->n_free_blocks--;
                for (int j = i; j < alloc->n_free_blocks; j++) {
                    alloc->free_blocks[j] = alloc->free_blocks[j+1];
                }
            }
            return;
        }
    }
    // otherwise, add a new block
    GGML_ASSERT(alloc->n_free_blocks < MAX_FREE_BLOCKS && "out of free blocks");
    // insert the new block in the correct position to keep the array sorted by address (to make merging blocks faster)
    int insert_pos = 0;
    while (insert_pos < alloc->n_free_blocks && alloc->free_blocks[insert_pos].offset < offset) {
        insert_pos++;
    }
    // shift all blocks from insert_pos onward to make room for the new block
    for (int i = alloc->n_free_blocks; i > insert_pos; i--) {
        alloc->free_blocks[i] = alloc->free_blocks[i-1];
    }
    // insert the new block
    alloc->free_blocks[insert_pos].offset = offset;
    alloc->free_blocks[insert_pos].size = size;
    alloc->n_free_blocks++;

    GGML_UNUSED(tensor);
}